

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O0

int ion_declared(Symbol *s)

{
  int used;
  Item *q;
  Symbol *s_local;
  
  used = 0;
  for (q = useion->next; q != useion; q = q->next->next->next->next) {
    if ((Symbol *)(q->element).itm == s) {
      used = 1;
    }
  }
  return used;
}

Assistant:

int ion_declared(Symbol* s) {
	Item* q;
	int used = 0;
	ITERATE(q, useion) {
		if (SYM(q) == s) {
			used = 1;
		}
		q = q->next->next->next;
	}
	return used;
}